

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DriveStrengthSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DriveStrengthSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Token openParen;
  Token strength0;
  Token comma;
  Token strength1;
  Token closeParen;
  DriveStrengthSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (DriveStrengthSyntax *)allocate(this,0x60,8);
  openParen.kind = args->kind;
  openParen._2_1_ = args->field_0x2;
  openParen.numFlags.raw = (args->numFlags).raw;
  openParen.rawLen = args->rawLen;
  openParen.info = args->info;
  strength0.kind = args_1->kind;
  strength0._2_1_ = args_1->field_0x2;
  strength0.numFlags.raw = (args_1->numFlags).raw;
  strength0.rawLen = args_1->rawLen;
  strength0.info = args_1->info;
  comma.kind = args_2->kind;
  comma._2_1_ = args_2->field_0x2;
  comma.numFlags.raw = (args_2->numFlags).raw;
  comma.rawLen = args_2->rawLen;
  comma.info = args_2->info;
  strength1.kind = args_3->kind;
  strength1._2_1_ = args_3->field_0x2;
  strength1.numFlags.raw = (args_3->numFlags).raw;
  strength1.rawLen = args_3->rawLen;
  strength1.info = args_3->info;
  closeParen.kind = args_4->kind;
  closeParen._2_1_ = args_4->field_0x2;
  closeParen.numFlags.raw = (args_4->numFlags).raw;
  closeParen.rawLen = args_4->rawLen;
  closeParen.info = args_4->info;
  slang::syntax::DriveStrengthSyntax::DriveStrengthSyntax
            (this_00,openParen,strength0,comma,strength1,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }